

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeComponentGraph.cxx
# Opt level: O0

void __thiscall cmComputeComponentGraph::TransferEdges(cmComputeComponentGraph *this)

{
  int iVar1;
  int n_00;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  reference this_00;
  vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *this_01;
  pointer this_02;
  cmGraphEdge local_48;
  int local_40;
  int local_3c;
  int j_component;
  int j;
  __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
  local_30;
  const_iterator ni;
  EdgeList *nl;
  int local_18;
  int i_component;
  int i;
  int n;
  cmComputeComponentGraph *this_local;
  
  sVar3 = std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::size
                    (&this->InputGraph->
                      super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>);
  for (local_18 = 0; local_18 < (int)sVar3; local_18 = local_18 + 1) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->TarjanComponents,(long)local_18);
    iVar1 = *pvVar4;
    ni._M_current =
         (cmGraphEdge *)
         std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::operator[]
                   (&this->InputGraph->
                     super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,(long)local_18)
    ;
    local_30._M_current =
         (cmGraphEdge *)
         std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::begin
                   ((vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *)ni._M_current);
    while( true ) {
      _j_component = std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::end(ni._M_current);
      bVar2 = __gnu_cxx::operator!=
                        (&local_30,
                         (__normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
                          *)&j_component);
      if (!bVar2) break;
      this_00 = __gnu_cxx::
                __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
                ::operator*(&local_30);
      local_3c = cmGraphEdge::operator_cast_to_int(this_00);
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->TarjanComponents,(long)local_3c);
      local_40 = *pvVar4;
      if (iVar1 != local_40) {
        this_01 = &std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::operator[]
                             (&(this->ComponentGraph).
                               super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
                              (long)iVar1)->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
        n_00 = local_40;
        this_02 = __gnu_cxx::
                  __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
                  ::operator->(&local_30);
        bVar2 = cmGraphEdge::IsStrong(this_02);
        cmGraphEdge::cmGraphEdge(&local_48,n_00,bVar2);
        std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::push_back(this_01,&local_48);
      }
      __gnu_cxx::
      __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
      ::operator++(&local_30);
    }
  }
  return;
}

Assistant:

void cmComputeComponentGraph::TransferEdges()
{
  // Map inter-component edges in the original graph to edges in the
  // component graph.
  int n = static_cast<int>(this->InputGraph.size());
  for (int i = 0; i < n; ++i) {
    int i_component = this->TarjanComponents[i];
    EdgeList const& nl = this->InputGraph[i];
    for (EdgeList::const_iterator ni = nl.begin(); ni != nl.end(); ++ni) {
      int j = *ni;
      int j_component = this->TarjanComponents[j];
      if (i_component != j_component) {
        // We do not attempt to combine duplicate edges, but instead
        // store the inter-component edges with suitable multiplicity.
        this->ComponentGraph[i_component].push_back(
          cmGraphEdge(j_component, ni->IsStrong()));
      }
    }
  }
}